

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

pair<double,_double> __thiscall HPresolve::getImpliedRowBounds(HPresolve *this,int row)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  vector<int,_std::allocator<int>_> *this_04;
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *this_05;
  size_type sVar4;
  size_type sVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  pair<double,_double> pVar7;
  double local_68;
  double local_60;
  
  this_01 = &(this->super_HPreData).ARstart;
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)row);
  this_00 = &(this->super_HPreData).colLower;
  this_02 = &(this->super_HPreData).colUpper;
  this_03 = &(this->super_HPreData).ARindex;
  this_04 = &(this->super_HPreData).flagCol;
  this_05 = &(this->super_HPreData).ARvalue;
  local_60 = 0.0;
  for (sVar5 = (size_type)*pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)(row + 1)),
      (long)sVar5 < (long)*pvVar2; sVar5 = sVar5 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar5);
    sVar4 = (size_type)*pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_04,sVar4);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_05,sVar5);
      if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar4);
        pvVar6 = this_00;
        if (-1e+200 < *pvVar3) goto LAB_00142fc3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar4);
        pvVar6 = this_02;
        if (*pvVar3 <= 1e+200 && *pvVar3 != 1e+200) {
LAB_00142fc3:
          pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_05,sVar5);
          dVar1 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::at(pvVar6,sVar4);
          local_60 = local_60 + dVar1 * *pvVar3;
          goto LAB_00142ffb;
        }
      }
      local_60 = -1e+200;
      break;
    }
LAB_00142ffb:
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)row);
  sVar5 = (size_type)*pvVar2;
  local_68 = 0.0;
  do {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)(row + 1));
    if ((long)*pvVar2 <= (long)sVar5) {
LAB_0014310c:
      pVar7.second = local_68;
      pVar7.first = local_60;
      return pVar7;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar5);
    sVar4 = (size_type)*pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_04,sVar4);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_05,sVar5);
      if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar4);
        pvVar6 = this_02;
        if (*pvVar3 <= 1e+200 && *pvVar3 != 1e+200) goto LAB_001430bd;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,sVar4);
        pvVar6 = this_00;
        if (-1e+200 < *pvVar3) {
LAB_001430bd:
          pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_05,sVar5);
          dVar1 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::at(pvVar6,sVar4);
          local_68 = local_68 + dVar1 * *pvVar3;
          goto LAB_001430f0;
        }
      }
      local_68 = 1e+200;
      goto LAB_0014310c;
    }
LAB_001430f0:
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

pair<double, double> HPresolve::getImpliedRowBounds(int row) {
	double g=0;
	double h=0;

	int col;
	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colUpper.at(col) < HSOL_CONST_INF)
					g+= ARvalue.at(k)*colUpper.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
			else {
				if (colLower.at(col) > -HSOL_CONST_INF)
					g+= ARvalue.at(k)*colLower.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
		}
	}

	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colLower.at(col) > -HSOL_CONST_INF)
					h+= ARvalue.at(k)*colLower.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}

			}
			else {
				if (colUpper.at(col) < HSOL_CONST_INF)
					h+= ARvalue.at(k)*colUpper.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}
			}
		}
	}
	return make_pair(g, h);
}